

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsfe_Emu.cpp
# Opt level: O2

blargg_err_t
read_strs(Data_Reader *in,long size,blargg_vector<char> *chars,blargg_vector<const_char_*> *strs)

{
  int iVar1;
  blargg_err_t pcVar2;
  undefined4 extraout_var;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  pcVar2 = blargg_vector<char>::resize(chars,size + 1);
  if (pcVar2 == (blargg_err_t)0x0) {
    chars->begin_[size] = '\0';
    iVar1 = (*in->_vptr_Data_Reader[3])(in,chars->begin_,size);
    pcVar2 = (blargg_err_t)CONCAT44(extraout_var,iVar1);
    if ((pcVar2 == (blargg_err_t)0x0) &&
       (pcVar2 = blargg_vector<const_char_*>::resize(strs,0x80), pcVar2 == (blargg_err_t)0x0)) {
      uVar3 = 0;
      lVar5 = 0;
      while( true ) {
        lVar4 = (long)(int)lVar5;
        if (size <= lVar4) {
          pcVar2 = blargg_vector<const_char_*>::resize(strs,uVar3 & 0xffffffff);
          return pcVar2;
        }
        if (((long)(int)strs->size_ <= (long)uVar3) &&
           (pcVar2 = blargg_vector<const_char_*>::resize(strs,uVar3 * 2),
           pcVar2 != (blargg_err_t)0x0)) break;
        strs->begin_[uVar3] = chars->begin_ + lVar4;
        uVar3 = uVar3 + 1;
        for (; (lVar5 = size, size != lVar4 && (lVar5 = lVar4, chars->begin_[lVar4] != '\0'));
            lVar4 = lVar4 + 1) {
        }
        lVar5 = lVar5 + 1;
      }
    }
  }
  return pcVar2;
}

Assistant:

static blargg_err_t read_strs( Data_Reader& in, long size, blargg_vector<char>& chars,
		blargg_vector<const char*>& strs )
{
	RETURN_ERR( chars.resize( size + 1 ) );
	chars [size] = 0; // in case last string doesn't have terminator
	RETURN_ERR( in.read( &chars [0], size ) );
	
	RETURN_ERR( strs.resize( 128 ) );
	int count = 0;
	for ( int i = 0; i < size; i++ )
	{
		if ( (int) strs.size() <= count )
			RETURN_ERR( strs.resize( count * 2 ) );
		strs [count++] = &chars [i];
		while ( i < size && chars [i] )
			i++;
	}
	
	return strs.resize( count );
}